

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb-c.cpp
# Opt level: O2

duckdb_instance_cache duckdb_create_instance_cache(void)

{
  __uniq_ptr_impl<duckdb::DBInstanceCache,_std::default_delete<duckdb::DBInstanceCache>_> __p;
  tuple<duckdb::DBInstanceCache_*,_std::default_delete<duckdb::DBInstanceCache>_> in_RAX;
  duckdb_instance_cache this;
  __uniq_ptr_impl<duckdb::DBInstanceCache,_std::default_delete<duckdb::DBInstanceCache>_> local_18;
  
  local_18._M_t.
  super__Tuple_impl<0UL,_duckdb::DBInstanceCache_*,_std::default_delete<duckdb::DBInstanceCache>_>.
  super__Head_base<0UL,_duckdb::DBInstanceCache_*,_false>._M_head_impl =
       (tuple<duckdb::DBInstanceCache_*,_std::default_delete<duckdb::DBInstanceCache>_>)
       (tuple<duckdb::DBInstanceCache_*,_std::default_delete<duckdb::DBInstanceCache>_>)
       in_RAX.
       super__Tuple_impl<0UL,_duckdb::DBInstanceCache_*,_std::default_delete<duckdb::DBInstanceCache>_>
       .super__Head_base<0UL,_duckdb::DBInstanceCache_*,_false>._M_head_impl;
  this = (duckdb_instance_cache)operator_new(8);
  *(tuple<duckdb::DBInstanceCache_*,_std::default_delete<duckdb::DBInstanceCache>_> *)this =
       (tuple<duckdb::DBInstanceCache_*,_std::default_delete<duckdb::DBInstanceCache>_>)0x0;
  duckdb::make_uniq<duckdb::DBInstanceCache>();
  __p._M_t.
  super__Tuple_impl<0UL,_duckdb::DBInstanceCache_*,_std::default_delete<duckdb::DBInstanceCache>_>.
  super__Head_base<0UL,_duckdb::DBInstanceCache_*,_false>._M_head_impl =
       local_18._M_t.
       super__Tuple_impl<0UL,_duckdb::DBInstanceCache_*,_std::default_delete<duckdb::DBInstanceCache>_>
       .super__Head_base<0UL,_duckdb::DBInstanceCache_*,_false>._M_head_impl;
  local_18._M_t.
  super__Tuple_impl<0UL,_duckdb::DBInstanceCache_*,_std::default_delete<duckdb::DBInstanceCache>_>.
  super__Head_base<0UL,_duckdb::DBInstanceCache_*,_false>._M_head_impl =
       (tuple<duckdb::DBInstanceCache_*,_std::default_delete<duckdb::DBInstanceCache>_>)
       (_Tuple_impl<0UL,_duckdb::DBInstanceCache_*,_std::default_delete<duckdb::DBInstanceCache>_>)
       0x0;
  std::__uniq_ptr_impl<duckdb::DBInstanceCache,_std::default_delete<duckdb::DBInstanceCache>_>::
  reset((__uniq_ptr_impl<duckdb::DBInstanceCache,_std::default_delete<duckdb::DBInstanceCache>_> *)
        this,(pointer)__p._M_t.
                      super__Tuple_impl<0UL,_duckdb::DBInstanceCache_*,_std::default_delete<duckdb::DBInstanceCache>_>
                      .super__Head_base<0UL,_duckdb::DBInstanceCache_*,_false>._M_head_impl);
  std::unique_ptr<duckdb::DBInstanceCache,_std::default_delete<duckdb::DBInstanceCache>_>::
  ~unique_ptr((unique_ptr<duckdb::DBInstanceCache,_std::default_delete<duckdb::DBInstanceCache>_> *)
              &local_18);
  return this;
}

Assistant:

duckdb_instance_cache duckdb_create_instance_cache() {
	auto wrapper = new DBInstanceCacheWrapper();
	wrapper->instance_cache = duckdb::make_uniq<duckdb::DBInstanceCache>();
	return reinterpret_cast<duckdb_instance_cache>(wrapper);
}